

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.hpp
# Opt level: O3

void __thiscall
viennamath::rt_expr<viennamath::rt_expression_interface<double>>::
rt_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_mult<double>,viennamath::ct_variable<0ul>>,viennamath::op_plus<double>,viennamath::ct_variable<1ul>>
          (rt_expr<viennamath::rt_expression_interface<double>> *this,
          ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>
          *other)

{
  rt_binary_expr<viennamath::rt_expression_interface<double>> *prVar1;
  rt_binary_expr<viennamath::rt_expression_interface<double>> *this_00;
  
  *(undefined8 *)this = 0;
  this_00 = (rt_binary_expr<viennamath::rt_expression_interface<double>> *)operator_new(0x20);
  rt_binary_expr<viennamath::rt_expression_interface<double>>::
  rt_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_mult<double>,viennamath::ct_variable<0ul>>,viennamath::op_plus<double>,1ul>
            (this_00,other);
  prVar1 = *(rt_binary_expr<viennamath::rt_expression_interface<double>> **)this;
  if (prVar1 != this_00) {
    if (prVar1 != (rt_binary_expr<viennamath::rt_expression_interface<double>> *)0x0) {
      (**(code **)(*(long *)prVar1 + 8))();
    }
    *(rt_binary_expr<viennamath::rt_expression_interface<double>> **)this = this_00;
  }
  return;
}

Assistant:

rt_expr(ct_binary_expr<LHS, OP, RHS> const & other)
      {
        rt_expr_ = std::auto_ptr<InterfaceType>(new rt_binary_expr<InterfaceType>(other));
      }